

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::Psbt(Psbt *this)

{
  Psbt *in_RDI;
  
  cfd::core::Psbt::Psbt(in_RDI);
  *(undefined ***)in_RDI = &PTR__Psbt_0057e368;
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  set((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       *)0x3c2164);
  return;
}

Assistant:

Psbt::Psbt() : cfd::core::Psbt() {}